

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmult.cc
# Opt level: O2

void do_work(void)

{
  int iVar1;
  int ndim;
  
  iVar1 = GA_Nodeid();
  for (ndim = 2; ndim != 8; ndim = ndim + 1) {
    test(0x3eb,ndim);
    test(0x3ec,ndim);
    test(0x3ef,ndim);
    if (iVar1 == 0) {
      puts("\n");
    }
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  return;
}

Assistant:

void
do_work() {
  int i;
  int me = GA_Nodeid();
 
  for(i=2; i<=GA_MAX_DIM; i++) {
     test(C_FLOAT, i);
     test(C_DBL,   i);
     test(C_DCPL,  i);
     if(me == 0) printf("\n\n");
    GA::SERVICES.sync();
  }
}